

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts,ConstType type)

{
  pointer *ppCVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  long lVar5;
  undefined8 *puVar6;
  iterator __position;
  byte bVar7;
  Token token;
  undefined1 auStack_f8 [72];
  Token local_b0;
  Token local_70;
  
  bVar7 = 0;
  do {
    bVar2 = PeekMatchLpar(this,Const);
    if ((((!bVar2) && (bVar2 = PeekMatchLpar(this,RefNull), !bVar2)) &&
        (bVar2 = PeekMatchLpar(this,RefHost), !bVar2)) &&
       (bVar2 = PeekMatchLpar(this,RefFunc), !bVar2)) {
      return (Result)Ok;
    }
    Consume((Token *)auStack_f8,this);
    auStack_f8._16_4_ = 0;
    auStack_f8._20_4_ = 0;
    auStack_f8._24_4_ = 0;
    auStack_f8._0_8_ = (char *)0x0;
    auStack_f8._8_4_ = 0;
    auStack_f8._12_4_ = 0;
    auStack_f8._32_4_ = ~First;
    auStack_f8._40_8_ = auStack_f8._40_8_ & 0xffffffff00000000;
    auStack_f8._56_4_ = 0;
    TVar3 = Peek(this,0);
    if ((int)TVar3 < 0x59) {
      if (TVar3 == Const) {
        RVar4 = ParseConst(this,(Const *)auStack_f8,type);
        goto LAB_0017573e;
      }
      if (TVar3 != RefFunc) {
LAB_001757f6:
        __assert_fail("!\"unreachable\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                      ,0x977,"Result wabt::WastParser::ParseConstList(ConstVector *, ConstType)");
      }
      Consume(&local_70,this);
      ErrorUnlessOpcodeEnabled(this,&local_70);
      GetToken(&local_b0,this);
      auStack_f8._16_4_ = local_b0.loc.field_1._0_4_;
      auStack_f8._20_4_ = local_b0.loc.field_1._4_4_;
      auStack_f8._24_4_ = (undefined4)local_b0.loc.field_1._8_8_;
      auStack_f8._28_4_ = (undefined4)((ulong)local_b0.loc.field_1._8_8_ >> 0x20);
      auStack_f8._8_4_ = (undefined4)local_b0.loc.filename.size_;
      auStack_f8._12_4_ = (undefined4)(local_b0.loc.filename.size_ >> 0x20);
      auStack_f8._32_4_ = ~Export;
LAB_00175786:
      auStack_f8._40_8_ = (char *)0x0;
      auStack_f8._56_4_ = 0;
      auStack_f8._0_8_ = local_b0.loc.filename.data_;
    }
    else {
      if (TVar3 == RefNull) {
        Consume(&local_70,this);
        ErrorUnlessOpcodeEnabled(this,&local_70);
        GetToken(&local_b0,this);
        auStack_f8._16_4_ = local_b0.loc.field_1._0_4_;
        auStack_f8._20_4_ = local_b0.loc.field_1._4_4_;
        auStack_f8._24_4_ = (undefined4)local_b0.loc.field_1._8_8_;
        auStack_f8._28_4_ = (undefined4)((ulong)local_b0.loc.field_1._8_8_ >> 0x20);
        auStack_f8._8_4_ = (undefined4)local_b0.loc.filename.size_;
        auStack_f8._12_4_ = (undefined4)(local_b0.loc.filename.size_ >> 0x20);
        auStack_f8._32_4_ = ~Func;
        goto LAB_00175786;
      }
      if (TVar3 != RefHost) goto LAB_001757f6;
      RVar4 = ParseHostRef(this,(Const *)auStack_f8);
LAB_0017573e:
      if (RVar4.enum_ == Error) {
        return (Result)Error;
      }
    }
    RVar4 = Expect(this,Rpar);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    __position._M_current =
         (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Const,std::allocator<wabt::Const>>::_M_realloc_insert<wabt::Const_const&>
                ((vector<wabt::Const,std::allocator<wabt::Const>> *)consts,__position,
                 (Const *)auStack_f8);
    }
    else {
      puVar6 = (undefined8 *)auStack_f8;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        ((__position._M_current)->loc).filename.data_ = (char *)*puVar6;
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        __position._M_current = __position._M_current + (ulong)bVar7 * -0x10 + 8;
      }
      ppCVar1 = &(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts, ConstType type) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const) || PeekMatchLpar(TokenType::RefNull) ||
         PeekMatchLpar(TokenType::RefHost) ||
         PeekMatchLpar(TokenType::RefFunc)) {
    Consume();
    Const const_;
    switch (Peek()) {
      case TokenType::Const:
        CHECK_RESULT(ParseConst(&const_, type));
        break;
      case TokenType::RefNull: {
        auto token = Consume();
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_nullref();
        break;
      }
      case TokenType::RefFunc: {
        auto token = Consume();
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_funcref();
        break;
      }
      case TokenType::RefHost:
        CHECK_RESULT(ParseHostRef(&const_));
        break;
      default:
        assert(!"unreachable");
        return Result::Error;
    }
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}